

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.cc
# Opt level: O1

ts_nsec timed_fdb_commit(fdb_file_handle *fhandle,bool walflush)

{
  fdb_status fVar1;
  ts_nsec tVar2;
  ts_nsec tVar3;
  long lVar4;
  long lVar5;
  
  tVar2 = get_monotonic_ts();
  fVar1 = fdb_commit(fhandle,walflush);
  tVar3 = get_monotonic_ts();
  lVar4 = 0xffffffff;
  if (fVar1 == FDB_RESULT_SUCCESS) {
    lVar5 = tVar3 - tVar2;
    lVar4 = lVar5 + 1000000000;
    if (-1 < lVar5) {
      lVar4 = lVar5;
    }
    lVar4 = lVar4 / 1000;
  }
  return lVar4;
}

Assistant:

ts_nsec timed_fdb_commit(fdb_file_handle *fhandle, bool walflush){

  ts_nsec start, end;
  fdb_status status;

  start = get_monotonic_ts();
  if(walflush){
    status = fdb_commit(fhandle, FDB_COMMIT_MANUAL_WAL_FLUSH);
  } else {
    status = fdb_commit(fhandle, FDB_COMMIT_NORMAL);
  }

  end = get_monotonic_ts();

  if(status == FDB_RESULT_SUCCESS){
    return ts_diff(start, end);
  } else {
    return ERR_NS;
  }
}